

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

int __thiscall
cs_impl::any::holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_>::kill
          (holder<std::_Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*>_> *this,
          __pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((_DAT_00335e00 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &holder<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>>::allocator +
             _DAT_00335e00;
    _DAT_00335e00 = _DAT_00335e00 + 1;
    *puVar1 = this;
    return 0x335bf8;
  }
  operator_delete(this,0x28);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}